

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O2

int uv__async_fork(uv_loop_t *loop)

{
  uv__queue *puVar1;
  int iVar2;
  uv__queue queue;
  
  if ((loop->async_io_watcher).fd != -1) {
    uv__queue_move(&loop->async_handles,&queue);
    while (queue.next != &queue) {
      puVar1 = (queue.next)->next;
      (queue.next)->prev->next = puVar1;
      puVar1->prev = (queue.next)->prev;
      (queue.next)->next = &loop->async_handles;
      puVar1 = (loop->async_handles).prev;
      (queue.next)->prev = puVar1;
      puVar1->next = queue.next;
      (loop->async_handles).prev = queue.next;
      *(undefined4 *)&queue.next[1].next = 0;
      *(undefined4 *)&queue.next[-4].prev = 0;
    }
    iVar2 = loop->async_wfd;
    if (iVar2 != -1) {
      if (iVar2 != (loop->async_io_watcher).fd) {
        uv__close(iVar2);
      }
      loop->async_wfd = -1;
    }
    uv__io_stop(loop,&loop->async_io_watcher,1);
    uv__close((loop->async_io_watcher).fd);
    (loop->async_io_watcher).fd = -1;
    iVar2 = uv__async_start(loop);
    return iVar2;
  }
  return 0;
}

Assistant:

int uv__async_fork(uv_loop_t* loop) {
  struct uv__queue queue;
  struct uv__queue* q;
  uv_async_t* h;

  if (loop->async_io_watcher.fd == -1) /* never started */
    return 0;

  uv__queue_move(&loop->async_handles, &queue);
  while (!uv__queue_empty(&queue)) {
    q = uv__queue_head(&queue);
    h = uv__queue_data(q, uv_async_t, queue);

    uv__queue_remove(q);
    uv__queue_insert_tail(&loop->async_handles, q);

    /* The state of any thread that set pending is now likely corrupt in this
     * child because the user called fork, so just clear these flags and move
     * on. Calling most libc functions after `fork` is declared to be undefined
     * behavior anyways, unless async-signal-safe, for multithreaded programs
     * like libuv, and nothing interesting in pthreads is async-signal-safe.
     */
    h->pending = 0;
    /* This is the busy flag, and we just abruptly lost all other threads. */
    h->u.fd = 0;
  }

  /* Recreate these, since they still exist, but belong to the wrong pid now. */
  if (loop->async_wfd != -1) {
    if (loop->async_wfd != loop->async_io_watcher.fd)
      uv__close(loop->async_wfd);
    loop->async_wfd = -1;
  }

  uv__io_stop(loop, &loop->async_io_watcher, POLLIN);
  uv__close(loop->async_io_watcher.fd);
  loop->async_io_watcher.fd = -1;

  return uv__async_start(loop);
}